

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall QSslSocketPrivate::_q_errorSlot(QSslSocketPrivate *this,SocketError error)

{
  qint64 qVar1;
  TlsCryptograph *pTVar2;
  SocketError errorCode;
  long lVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (**(code **)(*(long *)&this->plainSocket->super_QAbstractSocket + 0xa0))
                    (this->plainSocket,CONCAT44(in_register_00000034,error));
  if ((lVar3 != 0) && (this->mode != UnencryptedMode)) {
    qVar1 = (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.readBufferMaxSize;
    pTVar2 = (this->backend)._M_t.
             super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
    (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.readBufferMaxSize = 0;
    if (pTVar2 != (TlsCryptograph *)0x0) {
      (**(code **)(*(long *)pTVar2 + 200))();
    }
    (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.readBufferMaxSize = qVar1;
  }
  errorCode = QAbstractSocket::error(&this->plainSocket->super_QAbstractSocket);
  QIODevice::errorString();
  QAbstractSocketPrivate::setErrorAndEmit((QAbstractSocketPrivate *)this,errorCode,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_errorSlot(QAbstractSocket::SocketError error)
{
    Q_UNUSED(error);
#ifdef QSSLSOCKET_DEBUG
    Q_Q(QSslSocket);
    qCDebug(lcSsl) << "QSslSocket::_q_errorSlot(" << error << ')';
    qCDebug(lcSsl) << "\tstate =" << q->state();
    qCDebug(lcSsl) << "\terrorString =" << q->errorString();
#endif
    // this moves encrypted bytes from plain socket into our buffer
    if (plainSocket->bytesAvailable() && mode != QSslSocket::UnencryptedMode) {
        qint64 tmpReadBufferMaxSize = readBufferMaxSize;
        readBufferMaxSize = 0; // reset temporarily so the plain sockets completely drained drained
        transmit();
        readBufferMaxSize = tmpReadBufferMaxSize;
    }

    setErrorAndEmit(plainSocket->error(), plainSocket->errorString());
}